

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::FunctionalTest3_4
          (FunctionalTest3_4 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"four_subroutines_with_two_uniforms",
             "Verify Get* API and draw calls");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dca400;
  this->m_n_active_subroutine_uniforms = 0;
  this->m_n_active_subroutine_uniform_locations = 0;
  this->m_n_active_subroutines = 0;
  this->m_n_active_subroutine_uniform_name_length = 0;
  this->m_n_active_subroutine_name_length = 0;
  this->m_n_active_subroutine_uniform_size = 0;
  return;
}

Assistant:

FunctionalTest3_4::FunctionalTest3_4(deqp::Context& context)
	: TestCase(context, "four_subroutines_with_two_uniforms", "Verify Get* API and draw calls")
	, m_n_active_subroutine_uniforms(0)
	, m_n_active_subroutine_uniform_locations(0)
	, m_n_active_subroutines(0)
	, m_n_active_subroutine_uniform_name_length(0)
	, m_n_active_subroutine_name_length(0)
	, m_n_active_subroutine_uniform_size(0)
{
	/* Nothing to be done here */
}